

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O2

int TPZShapeHDivConstantBound<pzshape::TPZShapeQuad>::ComputeNConnectShapeF(int connect,int order)

{
  int iVar1;
  
  iVar1 = 0;
  if (connect < 4) {
    iVar1 = (order + 2) * order + 1;
  }
  return iVar1;
}

Assistant:

int TPZShapeHDivConstantBound<TSHAPE>::ComputeNConnectShapeF(int connect, int order)
{
#ifdef DEBUG
    if (connect < 0 || connect > TSHAPE::NFacets) {
        DebugStop();
    }
#endif
    // int order = data.fHDivConnectOrders[connect];
    MElementType thistype = TSHAPE::Type();

    if(thistype == EOned)
    {
        order++;
        return order;
    }
    else if(thistype == ETriangle)
    {
        order++;
        if(connect < TSHAPE::NFacets) return 1 + (order-1)*(2*order+4)/4;
        else return 0;
    }
    else if(thistype == EQuadrilateral)
    {
        if(connect < TSHAPE::NFacets) return 1 + order*(order+2);
        else return 0;
    }

    DebugStop();
    unreachable();
 }